

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# hashtable.h
# Opt level: O0

void __thiscall hash_data::decode(hash_data *this,U64 *dkey)

{
  Movetype local_20;
  int sign;
  Movetype type;
  U8 t;
  U8 f;
  U64 *dkey_local;
  hash_data *this_local;
  
  sign._3_1_ = (undefined1)*dkey;
  sign._2_1_ = (undefined1)(*dkey >> 8);
  local_20 = (Movetype)(*dkey >> 0x10) & 0xff;
  this->bound = (U8)((*dkey & 0xf000000) >> 0x1a);
  this->depth = (char)((*dkey & 0xff0000000) >> 0x1e);
  this->score = (int16)((*dkey & 0xffff000000000) >> 0x26);
  this->score = this->score;
  this->age = (U8)*dkey;
  _type = dkey;
  dkey_local = (U64 *)this;
  Move::set(&this->move,(U8 *)((long)&sign + 3),(U8 *)((long)&sign + 2),&local_20);
  return;
}

Assistant:

inline void decode(const U64& dkey) {

		U8 f = U8(dkey & 0xFF);
		U8 t = U8((dkey & 0xFF00) >> 8);
		Movetype type = Movetype((dkey & 0xFF0000) >> 16);
		bound = U8((dkey & 0xF000000) >> 26);
		depth = U8((dkey & 0xFF0000000) >> 30);
		score = int16((dkey & 0xFFFF000000000) >> 38);
		int sign = int(dkey & (1ULL << 54));
		score = (sign == 1 ? -score : score);
		age = U8(dkey & 0x7F80000000000000 >> 55);

		move.set(f, t, type);
	}